

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinetic.c
# Opt level: O0

void massagereaction(Item *qREACTION,Item *qREACT1,Item *qlpar,Item *qcomma,Item *qrpar)

{
  char *pcVar1;
  Item *in_RDX;
  Item *in_RSI;
  Item *in_R8;
  Reaction *r1;
  char *in_stack_ffffffffffffffc8;
  Reaction *q;
  
  q = reactlist;
  reactlist = (Reaction *)emalloc((uint)((ulong)reactlist >> 0x20));
  reactlist->reactnext = q;
  reactlist->rterm[1] = rterm;
  reactlist->rterm[0] = lterm;
  pcVar1 = qconcat(in_RSI,in_RDX);
  reactlist->krate[0] = pcVar1;
  pcVar1 = qconcat(in_RSI,in_RDX);
  reactlist->krate[1] = pcVar1;
  reactlist->position = in_R8;
  replacstr((Item *)q,in_stack_ffffffffffffffc8);
  insertstr((Item *)q,in_stack_ffffffffffffffc8);
  replacstr((Item *)q,in_stack_ffffffffffffffc8);
  rterm = (Rterm *)0x0;
  return;
}

Assistant:

void massagereaction(qREACTION, qREACT1, qlpar, qcomma, qrpar)
	Item *qREACTION, *qREACT1, *qlpar, *qcomma, *qrpar;
{
	Reaction *r1;
	
	/*ARGSUSED*/
	r1 = reactlist;
	reactlist = (Reaction *)emalloc(sizeof(Reaction));
	reactlist->reactnext = r1;
	reactlist->rterm[1] = rterm;
	reactlist->rterm[0] = lterm;
	reactlist->krate[0] = qconcat(qlpar->next, qcomma->prev);
	reactlist->krate[1] = qconcat(qcomma->next, qrpar->prev);
	reactlist->position = qrpar;
	/*SUPPRESS 440*/
	replacstr(qREACTION, "/* ~");
	/*SUPPRESS 440*/
	Insertstr(qrpar, ")*/\n");
	/*SUPPRESS 440*/
	replacstr(qrpar, "/*REACTION*/\n");
	rterm = (Rterm *)0;
}